

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ptr.hpp
# Opt level: O0

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,
          Ptr<Catch::CumulativeReporterBase::SectionNode> *other)

{
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_20;
  Ptr<Catch::CumulativeReporterBase::SectionNode> temp;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *other_local;
  Ptr<Catch::CumulativeReporterBase::SectionNode> *this_local;
  
  temp.m_p = (SectionNode *)other;
  Ptr(&local_20,other);
  swap(this,&local_20);
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }